

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O0

void av1_tf_do_filtering_row(AV1_COMP *cpi,ThreadData_conflict *td,int mb_row)

{
  int iVar1;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  BLOCK_SIZE in_stack_0000000f;
  MACROBLOCKD *in_stack_00000010;
  YV12_BUFFER_CONFIG *in_stack_00000018;
  scale_factors *in_stack_00000040;
  MV *in_stack_00000048;
  uint8_t *in_stack_00000050;
  uint sse;
  int filter_offset;
  int source_offset;
  int filter_y_stride;
  int source_y_stride;
  int y_width;
  int y_height;
  int is_dc_diff_large;
  int subblock_mses [4];
  MV subblock_mvs [4];
  int frame;
  double blk_4x4_var_max;
  double blk_4x4_var_min;
  int is_hbd;
  _Bool allow_me_for_sub_blks;
  MV ref_mv;
  int mb_col;
  FRAME_DIFF *diff;
  FRAME_TYPE frame_type;
  GF_GROUP *gf_group;
  int filter_strength;
  uint8_t *pred;
  uint16_t *count;
  uint32_t *accum;
  int weight_calc_level_in_tf;
  int num_planes;
  int mi_w;
  int mi_h;
  int mb_width;
  int mb_height;
  TemporalFilterData *tf_data;
  MACROBLOCKD *mbd;
  MACROBLOCK *mb;
  YV12_BUFFER_CONFIG *frame_to_filter;
  BLOCK_SIZE block_size;
  int q_factor;
  int num_pels;
  double *noise_levels;
  scale_factors *scale;
  int compute_frame_diff;
  int filter_frame_idx;
  int num_frames;
  YV12_BUFFER_CONFIG **frames;
  TemporalFilterCtx *tf_ctx;
  double *in_stack_fffffffffffffe70;
  uint16_t *in_stack_fffffffffffffe78;
  _func_void_yv12_buffer_config_ptr_macroblockd_ptr_BLOCK_SIZE_int_int_int_double_ptr_MV_ptr_int_ptr_int_int_int_uint8_t_ptr_uint32_t_ptr_uint16_t_ptr
  *in_stack_fffffffffffffe80;
  YV12_BUFFER_CONFIG *in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  uint in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  int in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  uint16_t *count_00;
  uint16_t *in_stack_fffffffffffffec0;
  YV12_BUFFER_CONFIG *in_stack_fffffffffffffec8;
  int local_11c;
  short local_100;
  short local_fe;
  int local_fc;
  long *local_f8;
  char local_e9;
  long local_e8;
  int local_dc;
  uint8_t *local_d8;
  uint16_t *local_d0;
  double *local_c8;
  int local_c0;
  int local_bc;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  long local_a8;
  macroblockd *local_a0;
  long local_98;
  YV12_BUFFER_CONFIG *local_90;
  undefined1 local_81;
  int local_80;
  int local_7c;
  double *local_78;
  long *local_70;
  int local_64;
  int local_60;
  int local_5c;
  long *local_58;
  long *local_50;
  int local_44;
  long local_40;
  long *local_38;
  
  local_58 = in_RDI + 0x854a;
  local_5c = (int)in_RDI[0x857a];
  local_60 = (int)in_RDI[0x857c];
  local_64 = *(int *)((long)in_RDI + 0x42be4);
  local_70 = in_RDI + 0x857d;
  local_78 = (double *)(in_RDI + 0x857f);
  local_7c = (int)in_RDI[0x8582];
  local_80 = (int)in_RDI[0x8584];
  local_81 = 9;
  local_90 = (YV12_BUFFER_CONFIG *)local_58[local_60];
  local_a0 = (macroblockd *)(in_RSI + 0x1a0);
  local_a8 = in_RSI + 0x25d90;
  local_ac = 0x20;
  local_b0 = 0x20;
  local_b4 = 3;
  local_b8 = 3;
  local_98 = in_RSI;
  local_50 = local_58;
  local_44 = in_EDX;
  local_40 = in_RSI;
  local_38 = in_RDI;
  local_bc = av1_num_planes((AV1_COMMON *)(in_RDI + 0x77f0));
  local_c0 = (int)local_38[0xc11d];
  local_c8 = *(double **)(local_a8 + 0x18);
  local_d0 = *(uint16_t **)(local_a8 + 0x20);
  local_d8 = *(uint8_t **)(local_a8 + 0x28);
  local_dc = *(int *)((long)local_38 + 0x4235c);
  local_e8 = *local_38 + 400;
  local_e9 = *(char *)(*local_38 + 0x1810 + (ulong)*(byte *)(local_38 + 0xe258));
  local_f8 = (long *)(local_40 + 0x25d90);
  av1_set_mv_row_limits
            ((CommonModeInfoParams *)(local_38 + 0x7831),(FullMvLimits *)(local_98 + 0x1f6e4),
             local_44 << 3,8,*(int *)((long)local_38 + 0x42724));
  for (local_fc = 0; local_fc < (int)local_50[0x39]; local_fc = local_fc + 1) {
    av1_set_mv_col_limits
              ((CommonModeInfoParams *)(local_38 + 0x7831),(FullMvLimits *)(local_98 + 0x1f6e4),
               local_fc << 3,8,*(int *)((long)local_38 + 0x42724));
    memset(local_c8,0,(long)local_7c << 2);
    memset(local_d0,0,(long)local_7c << 1);
    memset(&local_100,0,4);
    if (*(int *)((long)local_38 + 0x608ec) != 0) {
      is_frame_high_bitdepth(local_90);
      get_log_var_4x4sub_blk
                ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 in_stack_fffffffffffffe88,(int)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                 (int)in_stack_fffffffffffffe80,
                 (BLOCK_SIZE)((ulong)in_stack_fffffffffffffe78 >> 0x38),in_stack_fffffffffffffe70,
                 (double *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 in_stack_fffffffffffffea8);
    }
    for (local_11c = 0; local_11c < local_5c; local_11c = local_11c + 1) {
      if (local_58[local_11c] != 0) {
        memset(&stack0xfffffffffffffec8,0,0x10);
        count_00 = (uint16_t *)0x7fffffff7fffffff;
        in_stack_fffffffffffffec0 = (uint16_t *)0x7fffffff7fffffff;
        in_stack_fffffffffffffeb4 = 0;
        if (local_11c == local_60) {
          local_100 = -local_100;
          local_fe = -local_fe;
        }
        else {
          tf_motion_search((AV1_COMP *)frame_to_filter,mb,(YV12_BUFFER_CONFIG *)mbd,
                           (YV12_BUFFER_CONFIG *)tf_data,mb_height._3_1_,mb_width,(int)noise_levels,
                           (MV *)scale,mi_h._3_1_,_filter_frame_idx,(int *)frames,(int *)tf_ctx);
        }
        if ((((*(int *)((long)local_38 + 0x42374) == 1) && (local_e9 == '\0')) &&
            (in_stack_fffffffffffffeb4 != 0)) &&
           (in_stack_fffffffffffffe94 = local_dc, 0 < local_dc)) {
          local_dc = 1;
          in_stack_fffffffffffffe94 = local_dc;
        }
        if (local_11c == local_60) {
          tf_apply_temporal_filter_self
                    ((YV12_BUFFER_CONFIG *)
                     CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                     (BLOCK_SIZE)((uint)in_stack_fffffffffffffe94 >> 0x18),in_stack_fffffffffffffe90
                     ,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20),(int)in_stack_fffffffffffffe88
                     ,(uint32_t *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     count_00);
        }
        else {
          tf_build_predictor(in_stack_00000018,in_stack_00000010,in_stack_0000000f,in_stack_00000008
                             ,unaff_retaddr_00,unaff_retaddr,in_stack_00000040,in_stack_00000048,
                             in_stack_00000050);
          iVar1 = is_frame_high_bitdepth(local_90);
          in_stack_fffffffffffffe70 = local_c8;
          in_stack_fffffffffffffe78 = local_d0;
          if (iVar1 == 0) {
            in_stack_fffffffffffffe80 = av1_apply_temporal_filter;
            (*av1_apply_temporal_filter)
                      (local_90,local_a0,BLOCK_32X32,local_44,local_fc,local_bc,local_78,
                       (MV *)&stack0xfffffffffffffec8,(int *)&stack0xfffffffffffffeb8,local_80,
                       local_dc,local_c0,local_d8,(uint32_t *)local_c8,local_d0);
          }
          else {
            in_stack_fffffffffffffe88 = (YV12_BUFFER_CONFIG *)av1_highbd_apply_temporal_filter;
            (*av1_highbd_apply_temporal_filter)
                      (local_90,local_a0,BLOCK_32X32,local_44,local_fc,local_bc,local_78,
                       (MV *)&stack0xfffffffffffffec8,(int *)&stack0xfffffffffffffeb8,local_80,
                       local_dc,local_c0,local_d8,(uint32_t *)local_c8,local_d0);
          }
        }
      }
    }
    tf_normalize_filtered_frame
              ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (BLOCK_SIZE)((uint)in_stack_fffffffffffffeac >> 0x18),in_stack_fffffffffffffea8,
               in_stack_fffffffffffffea4,in_stack_fffffffffffffea0,
               (uint32_t *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               in_stack_fffffffffffffec0,in_stack_fffffffffffffec8);
    if (local_64 != 0) {
      in_stack_fffffffffffffeb0 = 0x20 >> ((byte)local_a0->plane[0].subsampling_y & 0x1f);
      in_stack_fffffffffffffeac = 0x20 >> ((byte)local_a0->plane[0].subsampling_x & 0x1f);
      in_stack_fffffffffffffea8 = (local_90->field_4).field_0.y_stride;
      in_stack_fffffffffffffea4 = *(int *)(local_50[0x31] + 0x20);
      in_stack_fffffffffffffea0 =
           local_44 * in_stack_fffffffffffffeb0 * in_stack_fffffffffffffea8 +
           local_fc * in_stack_fffffffffffffeac;
      in_stack_fffffffffffffe9c =
           local_44 * in_stack_fffffffffffffeb0 * in_stack_fffffffffffffea4 +
           local_fc * in_stack_fffffffffffffeac;
      in_stack_fffffffffffffe98 = 0;
      (**(code **)(*local_38 + 0xcd08))
                ((local_90->field_5).field_0.y_buffer + in_stack_fffffffffffffea0,
                 in_stack_fffffffffffffea8,
                 *(long *)(local_50[0x31] + 0x28) + (long)in_stack_fffffffffffffe9c,
                 in_stack_fffffffffffffea4,&stack0xfffffffffffffe98);
      *local_f8 = (ulong)in_stack_fffffffffffffe98 + *local_f8;
      local_f8[1] = (ulong)in_stack_fffffffffffffe98 * (ulong)in_stack_fffffffffffffe98 +
                    local_f8[1];
    }
  }
  return;
}

Assistant:

void av1_tf_do_filtering_row(AV1_COMP *cpi, ThreadData *td, int mb_row) {
  TemporalFilterCtx *tf_ctx = &cpi->tf_ctx;
  YV12_BUFFER_CONFIG **frames = tf_ctx->frames;
  const int num_frames = tf_ctx->num_frames;
  const int filter_frame_idx = tf_ctx->filter_frame_idx;
  const int compute_frame_diff = tf_ctx->compute_frame_diff;
  const struct scale_factors *scale = &tf_ctx->sf;
  const double *noise_levels = tf_ctx->noise_levels;
  const int num_pels = tf_ctx->num_pels;
  const int q_factor = tf_ctx->q_factor;
  const BLOCK_SIZE block_size = TF_BLOCK_SIZE;
  const YV12_BUFFER_CONFIG *const frame_to_filter = frames[filter_frame_idx];
  MACROBLOCK *const mb = &td->mb;
  MACROBLOCKD *const mbd = &mb->e_mbd;
  TemporalFilterData *const tf_data = &td->tf_data;
  const int mb_height = block_size_high[block_size];
  const int mb_width = block_size_wide[block_size];
  const int mi_h = mi_size_high_log2[block_size];
  const int mi_w = mi_size_wide_log2[block_size];
  const int num_planes = av1_num_planes(&cpi->common);
  const int weight_calc_level_in_tf = cpi->sf.hl_sf.weight_calc_level_in_tf;
  uint32_t *accum = tf_data->accum;
  uint16_t *count = tf_data->count;
  uint8_t *pred = tf_data->pred;

  // Factor to control the filering strength.
  int filter_strength = cpi->oxcf.algo_cfg.arnr_strength;
  const GF_GROUP *gf_group = &cpi->ppi->gf_group;
  const FRAME_TYPE frame_type = gf_group->frame_type[cpi->gf_frame_index];

  // Do filtering.
  FRAME_DIFF *diff = &td->tf_data.diff;
  av1_set_mv_row_limits(&cpi->common.mi_params, &mb->mv_limits,
                        (mb_row << mi_h), (mb_height >> MI_SIZE_LOG2),
                        cpi->oxcf.border_in_pixels);
  for (int mb_col = 0; mb_col < tf_ctx->mb_cols; mb_col++) {
    av1_set_mv_col_limits(&cpi->common.mi_params, &mb->mv_limits,
                          (mb_col << mi_w), (mb_width >> MI_SIZE_LOG2),
                          cpi->oxcf.border_in_pixels);
    memset(accum, 0, num_pels * sizeof(accum[0]));
    memset(count, 0, num_pels * sizeof(count[0]));
    MV ref_mv = kZeroMv;  // Reference motion vector passed down along frames.
                          // Perform temporal filtering frame by frame.

    // Decide whether to perform motion search at 16x16 sub-block level or not
    // based on 4x4 sub-blocks source variance. Allow motion search for split
    // partition only if the difference between max and min source variance of
    // 4x4 blocks is greater than a threshold (which is derived empirically).
    bool allow_me_for_sub_blks = true;
    if (cpi->sf.hl_sf.allow_sub_blk_me_in_tf) {
      const int is_hbd = is_frame_high_bitdepth(frame_to_filter);
      // Initialize minimum variance to a large value and maximum variance to 0.
      double blk_4x4_var_min = DBL_MAX;
      double blk_4x4_var_max = 0;
      get_log_var_4x4sub_blk(cpi, frame_to_filter, mb_row, mb_col,
                             TF_BLOCK_SIZE, &blk_4x4_var_min, &blk_4x4_var_max,
                             is_hbd);
      // TODO(sanampudi.venkatarao@ittiam.com): Experiment and adjust the
      // threshold for high bit depth.
      if ((blk_4x4_var_max - blk_4x4_var_min) <= 4.0)
        allow_me_for_sub_blks = false;
    }

    for (int frame = 0; frame < num_frames; frame++) {
      if (frames[frame] == NULL) continue;

      // Motion search.
      MV subblock_mvs[4] = { kZeroMv, kZeroMv, kZeroMv, kZeroMv };
      int subblock_mses[4] = { INT_MAX, INT_MAX, INT_MAX, INT_MAX };
      int is_dc_diff_large = 0;

      if (frame ==
          filter_frame_idx) {  // Frame to be filtered.
                               // Change ref_mv sign for following frames.
        ref_mv.row *= -1;
        ref_mv.col *= -1;
      } else {  // Other reference frames.
        tf_motion_search(cpi, mb, frame_to_filter, frames[frame], block_size,
                         mb_row, mb_col, &ref_mv, allow_me_for_sub_blks,
                         subblock_mvs, subblock_mses, &is_dc_diff_large);
      }

      if (cpi->oxcf.kf_cfg.enable_keyframe_filtering == 1 &&
          frame_type == KEY_FRAME && is_dc_diff_large)
        filter_strength = AOMMIN(filter_strength, 1);

      // Perform weighted averaging.
      if (frame == filter_frame_idx) {  // Frame to be filtered.
        tf_apply_temporal_filter_self(frames[frame], mbd, block_size, mb_row,
                                      mb_col, num_planes, accum, count);
      } else {  // Other reference frames.
        tf_build_predictor(frames[frame], mbd, block_size, mb_row, mb_col,
                           num_planes, scale, subblock_mvs, pred);

        // All variants of av1_apply_temporal_filter() contain floating point
        // operations. Hence, clear the system state.

        // TODO(any): avx2/sse2 version should be changed to align with C
        // function before using. In particular, current avx2/sse2 function
        // only supports 32x32 block size and 5x5 filtering window.
        if (is_frame_high_bitdepth(frame_to_filter)) {  // for high bit-depth
#if CONFIG_AV1_HIGHBITDEPTH
          if (TF_BLOCK_SIZE == BLOCK_32X32 && TF_WINDOW_LENGTH == 5) {
            av1_highbd_apply_temporal_filter(
                frame_to_filter, mbd, block_size, mb_row, mb_col, num_planes,
                noise_levels, subblock_mvs, subblock_mses, q_factor,
                filter_strength, weight_calc_level_in_tf, pred, accum, count);
          } else {
#endif  // CONFIG_AV1_HIGHBITDEPTH
            av1_apply_temporal_filter_c(
                frame_to_filter, mbd, block_size, mb_row, mb_col, num_planes,
                noise_levels, subblock_mvs, subblock_mses, q_factor,
                filter_strength, weight_calc_level_in_tf, pred, accum, count);
#if CONFIG_AV1_HIGHBITDEPTH
          }
#endif  // CONFIG_AV1_HIGHBITDEPTH
        } else {
          // for 8-bit
          if (TF_BLOCK_SIZE == BLOCK_32X32 && TF_WINDOW_LENGTH == 5) {
            av1_apply_temporal_filter(
                frame_to_filter, mbd, block_size, mb_row, mb_col, num_planes,
                noise_levels, subblock_mvs, subblock_mses, q_factor,
                filter_strength, weight_calc_level_in_tf, pred, accum, count);
          } else {
            av1_apply_temporal_filter_c(
                frame_to_filter, mbd, block_size, mb_row, mb_col, num_planes,
                noise_levels, subblock_mvs, subblock_mses, q_factor,
                filter_strength, weight_calc_level_in_tf, pred, accum, count);
          }
        }
      }
    }
    tf_normalize_filtered_frame(mbd, block_size, mb_row, mb_col, num_planes,
                                accum, count, tf_ctx->output_frame);

    if (compute_frame_diff) {
      const int y_height = mb_height >> mbd->plane[0].subsampling_y;
      const int y_width = mb_width >> mbd->plane[0].subsampling_x;
      const int source_y_stride = frame_to_filter->y_stride;
      const int filter_y_stride = tf_ctx->output_frame->y_stride;
      const int source_offset =
          mb_row * y_height * source_y_stride + mb_col * y_width;
      const int filter_offset =
          mb_row * y_height * filter_y_stride + mb_col * y_width;
      unsigned int sse = 0;
      cpi->ppi->fn_ptr[block_size].vf(
          frame_to_filter->y_buffer + source_offset, source_y_stride,
          tf_ctx->output_frame->y_buffer + filter_offset, filter_y_stride,
          &sse);
      diff->sum += sse;
      diff->sse += sse * (int64_t)sse;
    }
  }
}